

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btCollisionShape * __thiscall
btCollisionWorldImporter::createBoxShape(btCollisionWorldImporter *this,btVector3 *halfExtents)

{
  btCollisionShape *this_00;
  btBoxShape *shape;
  btVector3 *in_stack_00000058;
  btBoxShape *in_stack_00000060;
  
  this_00 = (btCollisionShape *)btBoxShape::operator_new(0x187522);
  btBoxShape::btBoxShape(in_stack_00000060,in_stack_00000058);
  btAlignedObjectArray<btCollisionShape_*>::push_back
            ((btAlignedObjectArray<btCollisionShape_*> *)this_00,(btCollisionShape **)this_00);
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createBoxShape(const btVector3& halfExtents)
{
	btBoxShape* shape = new btBoxShape(halfExtents);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}